

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

void fnode_service_release(fnode_service_t *svc)

{
  int iVar1;
  int *in_RDI;
  
  if (((in_RDI != (int *)0x0) && (*in_RDI != 0)) &&
     (iVar1 = *in_RDI, *in_RDI = iVar1 + -1, iVar1 + -1 == 0)) {
    fnode_service_close_iface_sockets(svc);
    fnet_socket_uninit();
    memset(in_RDI,0,0x4c0);
    free(in_RDI);
  }
  return;
}

Assistant:

void fnode_service_release(fnode_service_t *svc)
{
    if (svc)
    {
        if (!svc->ref_counter)
            FLOG_ERR("Invalid interlink");
        else if (!--svc->ref_counter)
        {
            fnode_service_close_iface_sockets(svc);
            fnet_socket_uninit();
            memset(svc, 0, sizeof *svc);
            free(svc);
        }
    }
    else
        FLOG_ERR("Invalid interlink");
}